

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O2

void SUNAbortErrHandlerFn
               (int line,char *func,char *file,char *msg,SUNErrCode err_code,void *err_user_data,
               SUNContext sunctx)

{
  char *pcVar1;
  
  SUNLogger_Flush(sunctx->logger,SUN_LOGLEVEL_ALL);
  pcVar1 = sunCombineFileAndLine(line,file);
  if (msg == (char *)0x0) {
    msg = SUNGetErrMsg(err_code);
  }
  SUNLogger_QueueMsg(sunctx->logger,SUN_LOGLEVEL_ERROR,pcVar1,func,msg);
  free(pcVar1);
  pcVar1 = sunCombineFileAndLine
                     (0x5d,
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/sundials/sundials_errors.c"
                     );
  SUNLogger_QueueMsg(sunctx->logger,SUN_LOGLEVEL_ERROR,pcVar1,"SUNAbortErrHandlerFn",
                     "SUNAbortErrHandler: Calling abort now, use a different error handler to avoid program termination.\n"
                    );
  free(pcVar1);
  abort();
}

Assistant:

void SUNAbortErrHandlerFn(int line, const char* func, const char* file,
                          SUNDIALS_MAYBE_UNUSED const char* msg,
                          SUNDIALS_MAYBE_UNUSED SUNErrCode err_code,
                          SUNDIALS_MAYBE_UNUSED void* err_user_data,
                          SUNContext sunctx)
{
  /* Flush all buffered logging messages now before we abort */
  SUNLogger_Flush(sunctx->logger, SUN_LOGLEVEL_ALL);

  char* file_and_line = sunCombineFileAndLine(line, file);
  if (msg == NULL) { msg = SUNGetErrMsg(err_code); }
  SUNLogger_QueueMsg(sunctx->logger, SUN_LOGLEVEL_ERROR, file_and_line, func,
                     msg);
  free(file_and_line);
  /* It is convenient to have the exit message point to the message line,
     so we add 1 to the line number. As such, do not separate the following lines! */
  file_and_line = sunCombineFileAndLine(__LINE__ + 1, __FILE__);
  SUNLogger_QueueMsg(sunctx->logger, SUN_LOGLEVEL_ERROR, file_and_line, __func__,
                     "SUNAbortErrHandler: Calling abort now, use a different "
                     "error handler to avoid program termination.\n");
  free(file_and_line);
  abort();
}